

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O0

void __thiscall Restaurant::goMove(Restaurant *this,string *details)

{
  int src;
  int dst;
  int customerId_00;
  MoveCustomer *this_00;
  MoveCustomer *local_f8;
  MoveCustomer *local_f0;
  MoveCustomer *newMove;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [8];
  string token1;
  size_t pos1;
  allocator local_49;
  string local_48 [8];
  string delimiterSpace;
  int tableId2;
  int tableId1;
  int customerId;
  string *details_local;
  Restaurant *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48," ",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::string::string(local_88);
  std::__cxx11::string::find((string *)details,(ulong)local_48);
  std::__cxx11::string::substr((ulong)local_a8,(ulong)details);
  std::__cxx11::string::operator=(local_88,local_a8);
  std::__cxx11::string::~string(local_a8);
  src = std::__cxx11::stoi((string *)local_88,(size_t *)0x0,10);
  std::__cxx11::string::length();
  std::__cxx11::string::erase((ulong)details,0);
  std::__cxx11::string::find((string *)details,(ulong)local_48);
  std::__cxx11::string::substr((ulong)local_c8,(ulong)details);
  std::__cxx11::string::operator=(local_88,local_c8);
  std::__cxx11::string::~string(local_c8);
  dst = std::__cxx11::stoi((string *)local_88,(size_t *)0x0,10);
  std::__cxx11::string::length();
  std::__cxx11::string::erase((ulong)details,0);
  std::__cxx11::string::find((string *)details,(ulong)local_48);
  std::__cxx11::string::substr((ulong)&newMove,(ulong)details);
  std::__cxx11::string::operator=(local_88,(string *)&newMove);
  std::__cxx11::string::~string((string *)&newMove);
  customerId_00 = std::__cxx11::stoi((string *)local_88,(size_t *)0x0,10);
  std::__cxx11::string::length();
  std::__cxx11::string::erase((ulong)details,0);
  this_00 = (MoveCustomer *)operator_new(0x38);
  MoveCustomer::MoveCustomer(this_00,src,dst,customerId_00);
  local_f0 = this_00;
  (**(this_00->super_BaseAction)._vptr_BaseAction)(this_00,this);
  local_f8 = local_f0;
  std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::push_back
            (&this->actionsLog,(value_type *)&local_f8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void Restaurant::goMove(std::string details)
{
    int customerId;
    int tableId1;
    int tableId2;
    std::string delimiterSpace = " ";
    size_t pos1 = 0;
    std::string token1;
    pos1 = details.find(delimiterSpace);
    token1 = details.substr(0,pos1);
    customerId = std::stoi(token1);
    details.erase(0, pos1 + delimiterSpace.length());


    pos1 = details.find(delimiterSpace);
    token1 = details.substr(0,pos1);
    tableId1 = std::stoi(token1);
    details.erase(0, pos1 + delimiterSpace.length());

    pos1 = details.find(delimiterSpace);
    token1 = details.substr(0, pos1);
    tableId2 = std::stoi(token1);
    details.erase(0, pos1 + delimiterSpace.length());

    auto * newMove = new MoveCustomer(customerId, tableId1, tableId2);
    newMove->act(*this);
    actionsLog.push_back(newMove);

}